

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::interleave<signed_char>
          (Omega_h *this,
          vector<Omega_h::Read<signed_char>,_std::allocator<Omega_h::Read<signed_char>_>_> *arrays)

{
  ulong *puVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  int iVar5;
  void *in_RDX;
  void *extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int n;
  Read<signed_char> RVar10;
  Write<signed_char> out;
  vector<Omega_h::Read<signed_char>,_std::allocator<Omega_h::Read<signed_char>_>_> *__range2;
  type f;
  value_type array;
  Write<signed_char> local_a0;
  Alloc *local_90;
  ulong local_88;
  vector<Omega_h::Read<signed_char>,_std::allocator<Omega_h::Read<signed_char>_>_> *local_80;
  Write<signed_char> local_78;
  undefined1 local_68 [24];
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  
  puVar4 = *(ulong **)arrays;
  puVar1 = *(ulong **)(arrays + 8);
  if (puVar4 == puVar1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar7 = (ulong)((long)puVar1 - (long)puVar4) >> 4;
    puVar2 = (ulong *)*puVar4;
    if (((ulong)puVar2 & 1) == 0) {
      uVar9 = *puVar2;
    }
    else {
      uVar9 = (ulong)puVar2 >> 3;
    }
    while (n = (int)uVar9, local_80 = arrays, puVar4 != puVar1) {
      puVar3 = (undefined8 *)*puVar4;
      if (((ulong)puVar3 & 1) == 0) {
        iVar5 = (int)*puVar3;
      }
      else {
        iVar5 = (int)((ulong)puVar3 >> 3);
      }
      puVar4 = puVar4 + 2;
      if (iVar5 != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
    }
    std::__cxx11::string::string((string *)local_68,"",(allocator *)&local_40);
    local_90 = (Alloc *)this;
    Write<signed_char>::Write(&local_a0,n * (int)uVar7,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    lVar8 = 0;
    uVar9 = 0;
    if (0 < (int)uVar7) {
      uVar9 = uVar7 & 0xffffffff;
    }
    local_88 = uVar7;
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      Write<signed_char>::Write(&local_40,(Write<signed_char> *)(*(long *)local_80 + lVar8));
      Write<signed_char>::Write((Write<signed_char> *)local_68,&local_a0);
      local_68._16_4_ = (undefined4)local_88;
      local_68._20_4_ = (undefined4)uVar6;
      Write<signed_char>::Write(&local_50,&local_40);
      parallel_for<Omega_h::interleave<signed_char>(std::vector<Omega_h::Read<signed_char>,std::allocator<Omega_h::Read<signed_char>>>)::_lambda(int)_1_>
                (n,(type *)local_68,"interleave");
      interleave<signed_char>(std::vector<Omega_h::Read<signed_char>,std::allocator<Omega_h::Read<signed_char>>>)
      ::{lambda(int)#1}::~vector((_lambda_int__1_ *)local_68);
      Write<signed_char>::~Write(&local_40);
      lVar8 = lVar8 + 0x10;
    }
    Write<signed_char>::Write(&local_78,&local_a0);
    this = (Omega_h *)local_90;
    Read<signed_char>::Read((Read<signed_char> *)local_90,&local_78);
    Write<signed_char>::~Write(&local_78);
    Write<signed_char>::~Write(&local_a0);
    in_RDX = extraout_RDX;
  }
  RVar10.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}